

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O1

QRegularExpressionMatch __thiscall
QRegularExpressionMatchIterator::next(QRegularExpressionMatchIterator *this)

{
  QRegularExpressionMatchIteratorPrivate *pQVar1;
  QRegularExpressionMatchPrivate *pQVar2;
  QRegularExpressionMatch *__old_val;
  QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate> *in_RSI;
  long in_FS_OFFSET;
  QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate> local_28;
  QRegularExpression local_20;
  
  local_20.d.d.ptr =
       (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
       ((totally_ordered_wrapper<QRegularExpressionPrivate_*> *)(in_FS_OFFSET + 0x28))->ptr;
  pQVar1 = (in_RSI->d).ptr;
  pQVar2 = (pQVar1->next).d.d.ptr;
  if ((pQVar2->isValid == true) &&
     ((pQVar2->hasMatch != false || (pQVar2->hasPartialMatch != false)))) {
    if ((pQVar1 != (QRegularExpressionMatchIteratorPrivate *)0x0) &&
       ((__int_type)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> != 1)) {
      QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>::detach_helper(in_RSI);
    }
    pQVar1 = (in_RSI->d).ptr;
    QRegularExpressionMatchPrivate::nextMatch
              ((QRegularExpressionMatchPrivate *)&stack0xffffffffffffffd8);
    (this->d).d.ptr = (QRegularExpressionMatchIteratorPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = (pQVar1->next).d.d.ptr;
    (pQVar1->next).d.d.ptr = (QRegularExpressionMatchPrivate *)0x0;
    (this->d).d.ptr = (QRegularExpressionMatchIteratorPrivate *)pQVar2;
    (pQVar1->next).d.d.ptr = (QRegularExpressionMatchPrivate *)local_28.d.ptr;
    local_28.d.ptr =
         (totally_ordered_wrapper<QRegularExpressionMatchPrivate_*>)
         (QRegularExpressionMatchPrivate *)0x0;
    QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>::~QExplicitlySharedDataPointer
              (&stack0xffffffffffffffd8);
  }
  else {
    pQVar2 = (pQVar1->next).d.d.ptr;
    (this->d).d.ptr = (QRegularExpressionMatchIteratorPrivate *)pQVar2;
    if (pQVar2 != (QRegularExpressionMatchPrivate *)0x0) {
      LOCK();
      (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value = (Type)((int)(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                             super_QBasicAtomicInteger<int>._q_value + 1);
      UNLOCK();
    }
  }
  if ((QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
      ((totally_ordered_wrapper<QRegularExpressionPrivate_*> *)(in_FS_OFFSET + 0x28))->ptr ==
      local_20.d.d.ptr) {
    return (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
           (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QRegularExpressionMatch QRegularExpressionMatchIterator::next()
{
    if (!hasNext()) {
        qWarning("QRegularExpressionMatchIterator::next() called on an iterator already at end");
        return d.constData()->next;
    }

    d.detach();
    return std::exchange(d->next, d->next.d.constData()->nextMatch());
}